

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_DsdManCheckInv_rec(If_DsdMan_t *p,int iLit)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  while( true ) {
    if (iLit < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if ((p->vObjs).nSize <= (int)((uint)iLit >> 1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar1 = (p->vObjs).pArray[(uint)iLit >> 1];
    uVar2 = *(uint *)((long)pvVar1 + 4) & 7;
    if (uVar2 != 5) break;
    iVar3 = If_DsdManCheckInv_rec(p,*(int *)((long)pvVar1 + 0xc));
    if (iVar3 == 0) {
      return 0;
    }
    iLit = *(uint *)((long)pvVar1 + 0x10);
  }
  switch(uVar2) {
  case 2:
    return 1;
  case 3:
  case 6:
    goto switchD_00423c68_caseD_2;
  case 4:
    if (0x7ffffff < *(uint *)((long)pvVar1 + 4)) {
      uVar4 = 0;
      do {
        iVar3 = *(int *)((long)pvVar1 + uVar4 * 4 + 8);
        if (iVar3 == 0) {
          return 0;
        }
        iVar3 = If_DsdManCheckInv_rec(p,iVar3);
        if (iVar3 != 0) {
          return 1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < *(uint *)((long)pvVar1 + 4) >> 0x1b);
    }
switchD_00423c68_caseD_2:
    return 0;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x5b7,"int If_DsdManCheckInv_rec(If_DsdMan_t *, int)");
  }
}

Assistant:

int If_DsdManCheckInv_rec( If_DsdMan_t * p, int iLit )
{
    If_DsdObj_t * pObj;
    int i, iFanin;
    pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iLit) );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        return 1;
    if ( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_PRIME )
        return 0;
    if ( If_DsdObjType(pObj) == IF_DSD_XOR )
    {
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            if ( If_DsdManCheckInv_rec(p, iFanin) )
                return 1;
        return 0;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX )
        return If_DsdManCheckInv_rec(p, pObj->pFans[1]) && If_DsdManCheckInv_rec(p, pObj->pFans[2]);
    assert( 0 );
    return 0;
}